

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

int stbir_resize_extended(STBIR_RESIZE *resize)

{
  int iVar1;
  stbir__info *psVar2;
  void *pvVar3;
  int iVar4;
  bool bVar5;
  
  psVar2 = resize->samplers;
  if ((psVar2 == (stbir__info *)0x0) || (resize->needs_rebuild != 0)) {
    iVar1 = resize->called_alloc;
    if (psVar2 != (stbir__info *)0x0) {
      pvVar3 = psVar2->alloced_mem;
      if (pvVar3 != (void *)0x0) {
        psVar2->alloced_mem = (void *)0x0;
        free(pvVar3);
      }
      resize->samplers = (stbir__info *)0x0;
    }
    iVar4 = stbir_build_samplers_with_splits(resize,1);
    if (iVar4 == 0) {
      bVar5 = false;
    }
    else {
      resize->called_alloc = iVar1;
      bVar5 = resize->samplers != (stbir__info *)0x0;
    }
    if (!bVar5) {
      return (uint)(iVar4 != 0);
    }
  }
  stbir__perform_resize(resize->samplers,0,resize->splits);
  if (resize->called_alloc == 0) {
    psVar2 = resize->samplers;
    if (psVar2 != (stbir__info *)0x0) {
      pvVar3 = psVar2->alloced_mem;
      if (pvVar3 != (void *)0x0) {
        psVar2->alloced_mem = (void *)0x0;
        free(pvVar3);
      }
      resize->samplers = (stbir__info *)0x0;
      resize->called_alloc = 0;
    }
    resize->samplers = (stbir__info *)0x0;
  }
  return 1;
}

Assistant:

STBIRDEF int stbir_resize_extended( STBIR_RESIZE * resize )
{
  int result;

  if ( ( resize->samplers == 0 ) || ( resize->needs_rebuild ) )
  {
    int alloc_state = resize->called_alloc;  // remember allocated state

    if ( resize->samplers )
    {
      stbir__free_internal_mem( resize->samplers );
      resize->samplers = 0;
    }

    if ( !stbir_build_samplers( resize ) )
      return 0;

    resize->called_alloc = alloc_state;

    // if build_samplers succeeded (above), but there are no samplers set, then
    //   the area to stretch into was zero pixels, so don't do anything and return
    //   success
    if ( resize->samplers == 0 )
      return 1;
  }
  else
  {
    // didn't build anything - clear it
    STBIR_PROFILE_BUILD_CLEAR( resize->samplers );
  }

  // do resize
  result = stbir__perform_resize( resize->samplers, 0, resize->splits );

  // if we alloced, then free
  if ( !resize->called_alloc )
  {
    stbir_free_samplers( resize );
    resize->samplers = 0;
  }

  return result;
}